

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O1

void finalize_preconditioner<dense_parameters>
               (vw *param_1,bfgs *b,float regularization,dense_parameters *weights)

{
  uint32_t uVar1;
  float fVar2;
  weight *pwVar3;
  float *pfVar4;
  long lVar5;
  anon_union_4_2_947300a4 x;
  float fVar6;
  float fVar7;
  
  pwVar3 = weights->_begin;
  if (b->regularizers == (weight *)0x0) {
    if (pwVar3 != pwVar3 + weights->_weight_mask + 1) {
      uVar1 = weights->_stride_shift;
      fVar7 = 0.0;
      do {
        fVar6 = pwVar3[3] + regularization;
        fVar2 = fVar6;
        if (fVar6 <= fVar7) {
          fVar2 = fVar7;
        }
        fVar7 = fVar2;
        pwVar3[3] = (weight)(~-(uint)(0.0 < fVar6) & (uint)fVar6 |
                            (uint)(1.0 / fVar6) & -(uint)(0.0 < fVar6));
        pwVar3 = pwVar3 + (1L << ((byte)uVar1 & 0x3f));
      } while (pwVar3 != weights->_begin + weights->_weight_mask + 1);
      goto LAB_001c84d6;
    }
  }
  else if (pwVar3 != pwVar3 + weights->_weight_mask + 1) {
    uVar1 = weights->_stride_shift;
    fVar7 = 0.0;
    lVar5 = 0;
    do {
      fVar6 = b->regularizers[((ulong)(lVar5 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) * 2] +
              *(float *)((long)pwVar3 + lVar5 + 0xc);
      fVar2 = fVar6;
      if (fVar6 <= fVar7) {
        fVar2 = fVar7;
      }
      fVar7 = fVar2;
      *(uint *)((long)pwVar3 + lVar5 + 0xc) =
           ~-(uint)(0.0 < fVar6) & (uint)fVar6 | (uint)(1.0 / fVar6) & -(uint)(0.0 < fVar6);
      lVar5 = lVar5 + (1L << ((byte)uVar1 & 0x3f)) * 4;
    } while ((weight *)((long)pwVar3 + lVar5) != weights->_begin + weights->_weight_mask + 1);
    goto LAB_001c84d6;
  }
  fVar7 = 0.0;
LAB_001c84d6:
  pfVar4 = weights->_begin;
  if (pfVar4 != pfVar4 + weights->_weight_mask + 1) {
    fVar7 = (float)(~-(uint)(fVar7 == 0.0) & (uint)(10000.0 / fVar7));
    uVar1 = weights->_stride_shift;
    do {
      if ((((uint)*pfVar4 & 0x7fc00000) == 0x7f800000) || (fVar7 < *pfVar4)) {
        pfVar4[3] = fVar7;
      }
      pfVar4 = pfVar4 + (1L << ((byte)uVar1 & 0x3f));
    } while (pfVar4 != weights->_begin + weights->_weight_mask + 1);
  }
  return;
}

Assistant:

void finalize_preconditioner(vw& /* all */, bfgs& b, float regularization, T& weights)
{
  float max_hessian = 0.f;

  if (b.regularizers == nullptr)
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      (&(*w))[W_COND] += regularization;
      if ((&(*w))[W_COND] > max_hessian)
        max_hessian = (&(*w))[W_COND];
      if ((&(*w))[W_COND] > 0)
        (&(*w))[W_COND] = 1.f / (&(*w))[W_COND];
    }
  else
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      (&(*w))[W_COND] += b.regularizers[2 * (w.index() >> weights.stride_shift())];
      if ((&(*w))[W_COND] > max_hessian)
        max_hessian = (&(*w))[W_COND];
      if ((&(*w))[W_COND] > 0)
        (&(*w))[W_COND] = 1.f / (&(*w))[W_COND];
    }

  float max_precond = (max_hessian == 0.f) ? 0.f : max_precond_ratio / max_hessian;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    if (infpattern(*w) || *w > max_precond)
      (&(*w))[W_COND] = max_precond;
  }
}